

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

int Gia_ManPerformGlaOld(Gia_Man_t *pAig,Abs_Par_t *pPars,int fStartVta)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  sat_solver2 *psVar3;
  byte *pbVar4;
  uint *puVar5;
  int *piVar6;
  void *pvVar7;
  Gia_Obj_t *pGVar8;
  void *pvVar9;
  long lVar10;
  Gia_Rpr_t *pGVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  Gia_Man_t *p;
  Abc_Cex_t *pAVar17;
  Abs_Par_t *pAVar18;
  Gia_Man_t *pGVar19;
  Vec_Wrd_t *p_00;
  word *pwVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  void *pvVar23;
  Abc_Frame_t *pAbc;
  Vec_Int_t *pVVar24;
  Vec_Int_t *pVVar25;
  int *piVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  Abs_Par_t *pAVar30;
  long lVar31;
  long lVar32;
  Gia_Man_t *pGVar33;
  Gla_Man_t *p_01;
  Gia_Man_t *__ptr;
  Gia_Man_t *p_02;
  char *pcVar34;
  ulong uVar35;
  Gia_Man_t *pGVar36;
  int iVar37;
  int iVar38;
  double dVar39;
  int Status;
  int nConfls;
  timespec ts;
  uint local_474;
  int local_464;
  Vec_Int_t *local_460;
  long local_458;
  Abs_Par_t *local_450;
  ulong local_448;
  int local_43c;
  uint local_438;
  int local_434;
  undefined4 local_430;
  int local_42c;
  Gia_Man_t *local_428;
  uint local_420;
  int local_41c;
  Gia_Man_t local_418;
  
  local_450 = pPars;
  iVar13 = clock_gettime(3,(timespec *)&local_418);
  pAVar30 = local_450;
  if (iVar13 < 0) {
    local_458 = -1;
  }
  else {
    local_458 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
  }
  iVar13 = pAig->nRegs;
  pVVar24 = pAig->vCos;
  iVar37 = pVVar24->nSize;
  if (iVar37 - iVar13 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x670,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  iVar14 = local_450->nFramesMax;
  if ((iVar14 != 0) && (iVar14 < local_450->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x671,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if (iVar37 <= iVar13) {
LAB_0060f3d2:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar37 < 1) {
LAB_0060f3f1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar37 = *pVVar24->pArray;
  if ((long)iVar37 < 0) {
LAB_0060f337:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar27 = pAig->nObjs;
  if ((int)uVar27 <= iVar37) goto LAB_0060f337;
  pGVar2 = pAig->pObjs;
  pGVar8 = pGVar2 + iVar37;
  uVar15 = (uint)*(undefined8 *)pGVar8;
  if ((~*(ulong *)(pGVar8 + -(ulong)(uVar15 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
    if ((uVar15 >> 0x1d & 1) != 0) {
      if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
        free(pAig->pCexSeq);
        pAig->pCexSeq = (Abc_Cex_t *)0x0;
        iVar13 = pAig->nRegs;
      }
      pAVar17 = Abc_CexMakeTriv(iVar13,pAig->vCis->nSize - iVar13,1,0);
      pAig->pCexSeq = pAVar17;
      puts("Sequential miter is trivially SAT.");
      return 0;
    }
    puts("Sequential miter is trivially UNSAT.");
    return 1;
  }
  iVar37 = -1;
  lVar29 = local_458;
  if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
    if (fStartVta == 0) {
      pVVar25 = (Vec_Int_t *)malloc(0x10);
      uVar35 = 0x10;
      if (0xe < uVar27 - 1) {
        uVar35 = (ulong)uVar27;
      }
      pVVar25->nCap = (int)uVar35;
      piVar26 = (int *)malloc(uVar35 << 2);
      pVVar25->pArray = piVar26;
      pVVar25->nSize = uVar27;
      if (piVar26 != (int *)0x0) {
        memset(piVar26,0,(ulong)uVar27 * 4);
      }
      pAig->vGateClasses = pVVar25;
      *piVar26 = 1;
      if (pVVar24->nSize <= iVar13) goto LAB_0060f3d2;
      if (pVVar24->nSize < 1) goto LAB_0060f3f1;
      uVar15 = *pVVar24->pArray;
      if (((long)(int)uVar15 < 0) || (uVar27 <= uVar15)) goto LAB_0060f337;
      uVar15 = uVar15 - (*(uint *)(pGVar2 + (int)uVar15) & 0x1fffffff);
      if (((int)uVar15 < 0) || (uVar27 <= uVar15)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar26[uVar15] = 1;
      iVar37 = -1;
      pAVar30 = local_450;
      lVar29 = local_458;
    }
    else {
      iVar13 = local_450->nFramesStart;
      iVar38 = local_450->nTimeOut;
      iVar1 = local_450->fDumpVabs;
      local_450->nFramesMax = iVar13;
      iVar37 = 2;
      if (iVar13 / 2 < 2) {
        iVar37 = iVar13 / 2;
      }
      local_450->nFramesStart = iVar37 + 1;
      local_450->nTimeOut = 0x14;
      local_450->fDumpVabs = 0;
      iVar37 = Gia_VtaPerformInt(pAig,local_450);
      pAVar30->nFramesMax = iVar14;
      pAVar30->nFramesStart = iVar13;
      pAVar30->nTimeOut = iVar38;
      pAVar30->fDumpVabs = iVar1;
      pVVar24 = pAig->vGateClasses;
      if (pVVar24 != (Vec_Int_t *)0x0) {
        if (pVVar24->pArray != (int *)0x0) {
          free(pVVar24->pArray);
          pAig->vGateClasses->pArray = (int *)0x0;
          pVVar24 = pAig->vGateClasses;
          if (pVVar24 == (Vec_Int_t *)0x0) goto LAB_0060da2d;
        }
        free(pVVar24);
        pAig->vGateClasses = (Vec_Int_t *)0x0;
      }
LAB_0060da2d:
      lVar29 = local_458;
      if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
        pVVar24 = Gia_VtaConvertToGla(pAig,pAig->vObjClasses);
        pAig->vGateClasses = pVVar24;
        pVVar24 = pAig->vObjClasses;
        if (pVVar24 != (Vec_Int_t *)0x0) {
          if (pVVar24->pArray != (int *)0x0) {
            free(pVVar24->pArray);
            pAig->vObjClasses->pArray = (int *)0x0;
            pVVar24 = pAig->vObjClasses;
            if (pVVar24 == (Vec_Int_t *)0x0) goto LAB_0060daa4;
          }
          free(pVVar24);
          pAig->vObjClasses = (Vec_Int_t *)0x0;
        }
      }
LAB_0060daa4:
      if (iVar37 == 0) {
        return 0;
      }
      if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
        return iVar37;
      }
    }
  }
  pGVar36 = pAig;
  local_434 = iVar37;
  p = (Gia_Man_t *)Gla_ManStart(pAig,pAVar30);
  iVar37 = 3;
  iVar13 = clock_gettime(3,(timespec *)&local_418);
  if (iVar13 < 0) {
    lVar28 = -1;
  }
  else {
    lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
  }
  *(long *)&p->nLevels = lVar28 - lVar29;
  pAVar18 = *(Abs_Par_t **)&p->nRegs;
  iVar13 = pAVar18->nTimeOut;
  if ((long)iVar13 != 0) {
    psVar3 = (sat_solver2 *)(p->vHash).pArray;
    iVar37 = 3;
    iVar14 = clock_gettime(3,(timespec *)&local_418);
    if (iVar14 < 0) {
      lVar28 = -1;
    }
    else {
      lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    psVar3->nRuntimeLimit = lVar28 + (long)iVar13 * 1000000;
    pAVar18 = *(Abs_Par_t **)&p->nRegs;
    pAVar30 = local_450;
  }
  if (pAVar18->fVerbose != 0) {
    Abc_Print(iVar37,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(iVar37,"FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n",
              (ulong)(uint)pAVar30->nFramesMax,(ulong)(uint)pAVar30->nConfLimit,
              (ulong)(uint)pAVar30->nTimeOut,(ulong)(uint)pAVar30->nRatioMin);
    pGVar36 = (Gia_Man_t *)(ulong)(uint)pAVar30->nLearnedPerce;
    Abc_Print(iVar37,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pAVar30->nLearnedStart,(ulong)(uint)pAVar30->nLearnedDelta);
    Abc_Print(iVar37,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
    pAVar18 = *(Abs_Par_t **)&p->nRegs;
  }
  if (-1 < pAVar18->nFramesMax) {
    uVar35 = 0;
    local_438 = 0;
    local_43c = 0;
    local_430 = 0;
    local_458 = lVar29;
    local_428 = p;
LAB_0060dbda:
    local_42c = (p->vHash).pArray[0x8c];
    iVar13 = (int)uVar35;
    pAVar18->iFrame = iVar13;
    Gia_GlaAddTimeFrame((Gla_Man_t *)p,iVar13);
    uVar15 = iVar13 + 1;
    uVar27 = 0;
    local_448 = uVar35;
    do {
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      if (iVar13 < 0) {
        lVar29 = 1;
      }
      else {
        lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418.pSpec),8);
        lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + (long)local_418.pName * -1000000;
      }
      pGVar19 = (Gia_Man_t *)
                Gla_ManUnsatCore((Gla_Man_t *)p,(int)uVar35,(sat_solver2 *)(p->vHash).pArray,
                                 pAVar30->nConfLimit,(int)pGVar36,&local_464,&local_41c);
      piVar26 = (p->vHash).pArray;
      if (local_464 == -1) {
LAB_0060e6cc:
        uVar35 = local_448;
        pvVar23 = *(void **)(piVar26 + 0x7a);
        if (pvVar23 != (void *)0x0) {
          pvVar9 = *(void **)((long)pvVar23 + 0x20);
          pvVar7 = *(void **)((long)pvVar9 + 8);
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
          free(pvVar9);
          pvVar9 = *(void **)((long)pvVar23 + 0x18);
          pvVar7 = *(void **)((long)pvVar9 + 8);
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
          free(pvVar9);
          free(pvVar23);
        }
        piVar26[0x7a] = 0;
        piVar26[0x7b] = 0;
        lVar29 = local_458;
        local_474 = (uint)uVar35;
        goto LAB_0060e73d;
      }
      if (*(long *)(piVar26 + 0x98) != 0) {
        iVar13 = clock_gettime(3,(timespec *)&local_418);
        if (iVar13 < 0) {
          lVar28 = -1;
        }
        else {
          lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
        }
        piVar26 = (p->vHash).pArray;
        if (*(long *)(piVar26 + 0x98) < lVar28) goto LAB_0060e6cc;
      }
      if (local_464 == 1) {
        pvVar23 = *(void **)(piVar26 + 0x7a);
        if (pvVar23 != (void *)0x0) {
          pvVar9 = *(void **)((long)pvVar23 + 0x20);
          pvVar7 = *(void **)((long)pvVar9 + 8);
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
          free(pvVar9);
          pvVar9 = *(void **)((long)pvVar23 + 0x18);
          pvVar7 = *(void **)((long)pvVar9 + 8);
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
          free(pvVar9);
          free(pvVar23);
          p = local_428;
        }
        piVar26[0x7a] = 0;
        piVar26[0x7b] = 0;
        p_02 = (Gia_Man_t *)0x3;
        pGVar33 = &local_418;
        iVar13 = clock_gettime(3,(timespec *)pGVar33);
        if (iVar13 < 0) {
          lVar28 = -1;
        }
        else {
          lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
        }
        p->pReprsOld = (int *)((long)p->pReprsOld + lVar28 + lVar29);
        goto LAB_0060e355;
      }
      p_01 = (Gla_Man_t *)0x3;
      pGVar33 = &local_418;
      iVar13 = clock_gettime(3,(timespec *)pGVar33);
      iVar37 = (int)pGVar33;
      if (iVar13 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      *(long *)&p->nTravIds = *(long *)&p->nTravIds + lVar28 + lVar29;
      if (local_464 != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x6cd,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      *(int *)&p->vCis = *(int *)&p->vCis + 1;
      iVar13 = Abc_FrameIsBridgeMode();
      if ((iVar13 != 0) && (local_43c != 0)) {
        Gia_GlaSendCancel(p_01,iVar37);
        local_43c = 0;
      }
      pGVar33 = &local_418;
      clock_gettime(3,(timespec *)pGVar33);
      if (pAVar30->fAddLayer == 0) {
        p_02 = p;
        local_460 = Gla_ManRefinement((Gla_Man_t *)p);
        if (local_460 == (Vec_Int_t *)0x0) goto LAB_0060e2db;
      }
      else {
        local_460 = Gla_ManCollectPPis((Gla_Man_t *)p,(Vec_Int_t *)pGVar33);
      }
      uVar35 = local_448;
      pVVar24 = local_460;
      piVar26 = (p->vHash).pArray;
      if (uVar27 == 0) {
        if (piVar26[2] != piVar26[3]) {
          __assert_fail("s->qhead == s->qtail",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
        }
        piVar26[0x36] = *piVar26;
        piVar26[0x37] = piVar26[2];
        pbVar4 = *(byte **)(piVar26 + 0x72);
        if (pbVar4 != (byte *)0x0) {
          piVar26[0x38] =
               (*(int *)(pbVar4 + 0xc) << (*pbVar4 & 0x1f)) +
               **(int **)(*(long *)(pbVar4 + 0x18) + (long)*(int *)(pbVar4 + 0xc) * 8);
        }
        *(undefined8 *)(piVar26 + 0x22) = *(undefined8 *)(piVar26 + 0x1e);
        pGVar36 = *(Gia_Man_t **)(piVar26 + 0x2a);
        piVar26[0x20] =
             piVar26[0x24] << ((byte)piVar26[0x26] & 0x1f) |
             *(uint *)(&pGVar36->pName)[piVar26[0x24]];
        piVar26[0x21] =
             piVar26[0x25] << ((byte)piVar26[0x26] & 0x1f) |
             *(uint *)(&pGVar36->pName)[piVar26[0x25]];
        if (*(void **)(piVar26 + 0x10) != (void *)0x0) {
          piVar26[0xc] = piVar26[0xb];
          memcpy(*(void **)(piVar26 + 0x10),*(void **)(piVar26 + 0xe),(long)*piVar26 << 2);
          piVar26 = (p->vHash).pArray;
        }
        (p->vHTable).pArray[1] = 0;
        *(undefined4 *)&p->field_0x3c = *(undefined4 *)(*(long *)&p->nObjs + 4);
        if (*(long *)(piVar26 + 0x7a) != 0) {
          __assert_fail("p->pSat->pPrf2 == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x6f7,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
        }
        local_430 = *(undefined4 *)&p->vCos;
        if (*(long *)(piVar26 + 0x72) == 0) {
          puVar21 = (undefined8 *)calloc(1,0x30);
          *puVar21 = 0xffffffffffffffff;
          puVar22 = (undefined8 *)malloc(0x10);
          *puVar22 = 1000;
          pvVar23 = malloc(8000);
          puVar22[1] = pvVar23;
          puVar21[3] = puVar22;
          puVar22 = (undefined8 *)malloc(0x10);
          *puVar22 = 1000;
          pvVar23 = malloc(4000);
          puVar22[1] = pvVar23;
          puVar21[4] = puVar22;
          *(undefined8 **)(piVar26 + 0x7a) = puVar21;
          *(undefined4 *)&(p->vRefs).pArray = 0;
          puVar5 = *(uint **)&p->vRefs;
          uVar16 = *(uint *)(p->pSpec + 0x18);
          if ((int)*puVar5 < (int)uVar16) {
            if (*(void **)(puVar5 + 2) == (void *)0x0) {
              pvVar23 = malloc((long)(int)uVar16 << 2);
            }
            else {
              pvVar23 = realloc(*(void **)(puVar5 + 2),(long)(int)uVar16 << 2);
            }
            *(void **)(puVar5 + 2) = pvVar23;
            if (pvVar23 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *puVar5 = uVar16;
          }
          pVVar24 = local_460;
          if (0 < (int)uVar16) {
            memset(*(void **)(puVar5 + 2),0xff,(ulong)uVar16 * 4);
          }
          puVar5[1] = uVar16;
          piVar26 = (p->vHash).pArray;
          piVar6 = *(int **)(piVar26 + 0x7a);
          if (*piVar6 != -1) {
            __assert_fail("p->iFirst == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof2.h"
                          ,0x7a,"void Prf_ManRestart(Prf_Man_t *, Vec_Int_t *, int, int)");
          }
          uVar16 = pVVar24->nSize;
          iVar13 = (p->vRefs).nCap;
          iVar37 = (p->vRefs).nSize;
          *piVar6 = piVar26[0x84];
          piVar6[2] = (((int)uVar16 >> 6) + 1) - (uint)((uVar16 & 0x3f) == 0);
          piVar6[10] = iVar13;
          piVar6[0xb] = iVar37;
          piVar6[4] = 0;
          piVar6[5] = 0;
          *(undefined4 *)(*(long *)(piVar6 + 6) + 4) = 0;
          uVar35 = local_448;
        }
      }
      else {
        piVar26 = *(int **)(piVar26 + 0x7a);
        if (piVar26 != (int *)0x0) {
          if (*piVar26 < 0) {
            __assert_fail("p->iFirst >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof2.h"
                          ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          if (*(long *)(piVar26 + 4) != 0) {
            __assert_fail("p->pInfo == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof2.h"
                          ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          uVar16 = local_460->nSize + *(int *)&(p->vRefs).pArray;
          iVar13 = piVar26[2];
          if (iVar13 * 0x40 <= (int)uVar16) {
            iVar37 = (((int)uVar16 >> 6) + 1) - (uint)((uVar16 & 0x3f) == 0);
            iVar14 = iVar13 * 2;
            if (iVar37 == iVar14 || SBORROW4(iVar37,iVar14) != iVar37 + iVar13 * -2 < 0) {
              iVar37 = iVar14;
            }
            pvVar23 = *(void **)(piVar26 + 6);
            iVar13 = *(int *)((long)pvVar23 + 4) / iVar13;
            iVar14 = (iVar13 + 1000) * iVar37;
            local_420 = uVar27;
            p_00 = (Vec_Wrd_t *)malloc(0x10);
            if (iVar14 - 1U < 0xf) {
              iVar14 = 0x10;
            }
            p_00->nSize = 0;
            p_00->nCap = iVar14;
            if (iVar14 == 0) {
              pwVar20 = (word *)0x0;
            }
            else {
              pwVar20 = (word *)malloc((long)iVar14 << 3);
            }
            p_00->pArray = pwVar20;
            if (0 < iVar13) {
              iVar14 = 0;
              do {
                uVar27 = piVar26[2] * iVar14;
                if (((int)uVar27 < 0) || (*(int *)(*(long *)(piVar26 + 6) + 4) <= (int)uVar27)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                *(ulong *)(piVar26 + 4) = *(long *)(*(long *)(piVar26 + 6) + 8) + (ulong)uVar27 * 8;
                lVar29 = 0;
                if (0 < piVar26[2]) {
                  do {
                    Vec_WrdPush(p_00,*(word *)(*(long *)(piVar26 + 4) + lVar29 * 8));
                    lVar29 = lVar29 + 1;
                  } while (lVar29 < piVar26[2]);
                }
                iVar38 = iVar37 - (int)lVar29;
                if (iVar38 != 0 && (int)lVar29 <= iVar37) {
                  do {
                    Vec_WrdPush(p_00,0);
                    iVar38 = iVar38 + -1;
                  } while (iVar38 != 0);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 != iVar13);
              pvVar23 = *(void **)(piVar26 + 6);
            }
            if (*(void **)((long)pvVar23 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar23 + 8));
            }
            free(pvVar23);
            *(Vec_Wrd_t **)(piVar26 + 6) = p_00;
            piVar26[2] = iVar37;
            piVar26[4] = 0;
            piVar26[5] = 0;
            p = local_428;
            pVVar24 = local_460;
            uVar35 = local_448;
            uVar27 = local_420;
          }
        }
      }
      pAVar30 = local_450;
      pGVar19 = (Gia_Man_t *)(ulong)uVar27;
      Gia_GlaAddToAbs((Gla_Man_t *)p,pVVar24,1);
      Gia_GlaAddOneSlice((Gla_Man_t *)p,(int)uVar35,pVVar24);
      if (pVVar24->pArray != (int *)0x0) {
        free(pVVar24->pArray);
      }
      free(pVVar24);
      if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
        iVar13 = (p->vHash).pArray[0x8c];
        iVar37 = clock_gettime(3,(timespec *)&local_418);
        p = local_428;
        if (iVar37 < 0) {
          lVar29 = -1;
        }
        else {
          lVar29 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
        }
        Gla_ManAbsPrintFrame
                  ((Gla_Man_t *)local_428,-1,uVar15,iVar13 - local_42c,uVar27,lVar29 - local_458);
        pGVar36 = pGVar19;
      }
      uVar27 = uVar27 + 1;
    } while( true );
  }
  local_474 = 0;
LAB_0060e73d:
  if ((*(int *)(*(long *)&p->nRegs + 0x70) != 0) && (local_464 == -1)) {
    putchar(10);
  }
  pVVar24 = pAig->vGateClasses;
  if (pVVar24 != (Vec_Int_t *)0x0) {
    if (pVVar24->pArray != (int *)0x0) {
      free(pVVar24->pArray);
      pAig->vGateClasses->pArray = (int *)0x0;
      pVVar24 = pAig->vGateClasses;
      if (pVVar24 == (Vec_Int_t *)0x0) goto LAB_0060e7a8;
    }
    free(pVVar24);
    pAig->vGateClasses = (Vec_Int_t *)0x0;
  }
LAB_0060e7a8:
  pGVar36 = p;
  pVVar24 = Gla_ManTranslate((Gla_Man_t *)p);
  pAVar30 = local_450;
  iVar13 = (int)pGVar36;
  pAig->vGateClasses = pVVar24;
  lVar28 = *(long *)&p->nRegs;
  if (local_464 == -1) {
    if (*(int *)(lVar28 + 0x20) == 0) {
LAB_0060e913:
      uVar27 = pAVar30->nConfLimit;
      if ((uVar27 == 0) || ((p->vHash).pArray[0x8c] < (int)uVar27)) {
        pGVar36 = p;
        iVar37 = Gia_GlaAbsCount((Gla_Man_t *)p,0,0);
        iVar13 = (int)pGVar36;
        uVar27 = pAVar30->nRatioMin;
        if (iVar37 < (int)((100 - uVar27) * (p->nBufs + -1)) / 100) {
          Abc_Print(iVar13,"Abstraction stopped for unknown reason in frame %d.  ",(ulong)local_474)
          ;
          goto LAB_0060e9b7;
        }
        pcVar34 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
        uVar15 = local_474;
        goto LAB_0060e7d6;
      }
      uVar15 = *(uint *)(*(long *)&p->nRegs + 0x80);
      pcVar34 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
    }
    else {
      iVar13 = 3;
      iVar37 = clock_gettime(3,(timespec *)&local_418);
      if (iVar37 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      if (lVar28 < *(long *)((p->vHash).pArray + 0x98)) goto LAB_0060e913;
      uVar27 = *(uint *)(*(long *)&p->nRegs + 0x20);
      uVar15 = *(uint *)(*(long *)&p->nRegs + 0x80);
      pcVar34 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
    }
    Abc_Print(iVar13,pcVar34,(ulong)uVar27,(ulong)local_474,(ulong)uVar15);
  }
  else {
    *(int *)(lVar28 + 0x78) = *(int *)(lVar28 + 0x78) + 1;
    pcVar34 = "GLA completed %d frames with a %d-stable abstraction.  ";
    uVar15 = *(uint *)(lVar28 + 0x80);
    uVar27 = local_474;
LAB_0060e7d6:
    Abc_Print(iVar13,pcVar34,(ulong)uVar27,(ulong)uVar15);
  }
LAB_0060e9b7:
  iVar37 = 3;
  iVar13 = clock_gettime(3,(timespec *)&local_418);
  if (iVar13 < 0) {
    lVar28 = -1;
  }
  else {
    lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
  }
  Abc_Print(iVar37,"%s =","Time");
  Abc_Print(iVar37,"%9.2f sec\n",(double)(lVar28 - lVar29) / 1000000.0);
  if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
    iVar37 = 3;
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    lVar31 = -1;
    lVar28 = -1;
    if (-1 < iVar13) {
      lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    p->pNexts = (int *)(lVar28 - (long)((long)p->pReprsOld +
                                       (long)(&p->pReprs->field_0x0 +
                                             lVar29 + *(long *)&p->nLevels + *(long *)&p->nTravIds))
                       );
    Abc_Print(iVar37,"%s =","Runtime: Initializing");
    lVar28._0_4_ = p->nLevels;
    lVar28._4_4_ = p->nConstrs;
    iVar37 = 3;
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    if (-1 < iVar13) {
      lVar31 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar39 = 0.0;
    if (lVar31 != lVar29) {
      lVar31._0_4_ = p->nLevels;
      lVar31._4_4_ = p->nConstrs;
      local_460 = (Vec_Int_t *)((double)lVar31 * 100.0);
      iVar37 = 3;
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      if (iVar13 < 0) {
        lVar31 = -1;
      }
      else {
        lVar31 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar39 = (double)local_460 / (double)(lVar31 - lVar29);
    }
    Abc_Print(iVar37,"%9.2f sec (%6.2f %%)\n",(double)lVar28 / 1000000.0,dVar39);
    Abc_Print(iVar37,"%s =","Runtime: Solver UNSAT");
    piVar26 = p->pReprsOld;
    iVar37 = 3;
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    if (iVar13 < 0) {
      lVar28 = -1;
    }
    else {
      lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar39 = 0.0;
    if (lVar28 != lVar29) {
      local_460 = (Vec_Int_t *)((double)(long)p->pReprsOld * 100.0);
      iVar37 = 3;
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      if (iVar13 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar39 = (double)local_460 / (double)(lVar28 - lVar29);
    }
    Abc_Print(iVar37,"%9.2f sec (%6.2f %%)\n",(double)(long)piVar26 / 1000000.0,dVar39);
    Abc_Print(iVar37,"%s =","Runtime: Solver SAT  ");
    lVar32._0_4_ = p->nTravIds;
    lVar32._4_4_ = p->nFront;
    iVar37 = 3;
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    if (iVar13 < 0) {
      lVar28 = -1;
    }
    else {
      lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar39 = 0.0;
    if (lVar28 != lVar29) {
      lVar10._0_4_ = p->nTravIds;
      lVar10._4_4_ = p->nFront;
      local_460 = (Vec_Int_t *)((double)lVar10 * 100.0);
      iVar37 = 3;
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      if (iVar13 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar39 = (double)local_460 / (double)(lVar28 - lVar29);
    }
    Abc_Print(iVar37,"%9.2f sec (%6.2f %%)\n",(double)lVar32 / 1000000.0,dVar39);
    Abc_Print(iVar37,"%s =","Runtime: Refinement  ");
    pGVar11 = p->pReprs;
    iVar37 = 3;
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    if (iVar13 < 0) {
      lVar28 = -1;
    }
    else {
      lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar39 = 0.0;
    if (lVar28 != lVar29) {
      local_460 = (Vec_Int_t *)((double)(long)p->pReprs * 100.0);
      iVar37 = 3;
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      if (iVar13 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar39 = (double)local_460 / (double)(lVar28 - lVar29);
    }
    Abc_Print(iVar37,"%9.2f sec (%6.2f %%)\n",(double)(long)pGVar11 / 1000000.0,dVar39);
    Abc_Print(iVar37,"%s =","Runtime: Other       ");
    piVar26 = p->pNexts;
    iVar37 = 3;
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    if (iVar13 < 0) {
      lVar28 = -1;
    }
    else {
      lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar39 = 0.0;
    if (lVar28 != lVar29) {
      local_460 = (Vec_Int_t *)((double)(long)p->pNexts * 100.0);
      iVar37 = 3;
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      if (iVar13 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar39 = (double)local_460 / (double)(lVar28 - lVar29);
    }
    Abc_Print(iVar37,"%9.2f sec (%6.2f %%)\n",(double)(long)piVar26 / 1000000.0,dVar39);
    Abc_Print(iVar37,"%s =","Runtime: TOTAL       ");
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    lVar31 = -1;
    lVar28 = -1;
    if (-1 < iVar13) {
      lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    iVar37 = 3;
    iVar13 = clock_gettime(3,(timespec *)&local_418);
    if (-1 < iVar13) {
      lVar31 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar39 = 0.0;
    if (lVar31 != lVar29) {
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      lVar32 = -1;
      lVar31 = -1;
      if (-1 < iVar13) {
        lVar31 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      local_460 = (Vec_Int_t *)((double)(lVar31 - lVar29) * 100.0);
      iVar37 = 3;
      iVar13 = clock_gettime(3,(timespec *)&local_418);
      if (-1 < iVar13) {
        lVar32 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar39 = (double)local_460 / (double)(lVar32 - lVar29);
    }
    Abc_Print(iVar37,"%9.2f sec (%6.2f %%)\n",(double)(lVar28 - lVar29) / 1000000.0,dVar39);
    Gla_ManReportMemory((Gla_Man_t *)p);
  }
  Gla_ManStop((Gla_Man_t *)p);
  fflush(_stdout);
LAB_0060e2db:
  piVar26 = (p->vHash).pArray;
  __ptr = *(Gia_Man_t **)(piVar26 + 0x7a);
  if (__ptr != (Gia_Man_t *)0x0) {
    pGVar8 = __ptr->pObjs;
    pvVar23 = *(void **)&pGVar8->Value;
    if (pvVar23 != (void *)0x0) {
      free(pvVar23);
    }
    free(pGVar8);
    pvVar23 = *(void **)&__ptr->nObjs;
    pvVar9 = *(void **)((long)pvVar23 + 8);
    if (pvVar9 != (void *)0x0) {
      free(pvVar9);
    }
    free(pvVar23);
    free(__ptr);
    p_02 = __ptr;
  }
  piVar26[0x7a] = 0;
  piVar26[0x7b] = 0;
  pcVar34 = p->pSpec;
  pAVar17 = *(Abc_Cex_t **)(pcVar34 + 0x178);
  pcVar34[0x178] = '\0';
  pcVar34[0x179] = '\0';
  pcVar34[0x17a] = '\0';
  pcVar34[0x17b] = '\0';
  pcVar34[0x17c] = '\0';
  pcVar34[0x17d] = '\0';
  pcVar34[0x17e] = '\0';
  pcVar34[0x17f] = '\0';
  pAVar30 = local_450;
  if (pAVar17 != (Abc_Cex_t *)0x0) {
    if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
      putchar(10);
    }
    uVar35 = local_448;
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
    }
    pAig->pCexSeq = pAVar17;
    local_434 = 0;
    pGVar36 = pAig;
    iVar13 = Gia_ManVerifyCex(pAig,pAVar17,0);
    iVar37 = (int)pGVar36;
    if (iVar13 == 0) {
      Abc_Print(iVar37,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    Abc_Print(iVar37,"Counter-example detected in frame %d.  ",uVar35 & 0xffffffff);
    lVar29 = local_458;
    *(int *)(*(long *)&p->nRegs + 0x78) = pAVar17->iFrame + -1;
    pVVar24 = pAig->vGateClasses;
    if (pVVar24 == (Vec_Int_t *)0x0) goto LAB_0060e9b7;
    if (pVVar24->pArray != (int *)0x0) {
      free(pVVar24->pArray);
      pAig->vGateClasses->pArray = (int *)0x0;
      pVVar24 = pAig->vGateClasses;
      if (pVVar24 == (Vec_Int_t *)0x0) goto LAB_0060e9b7;
    }
    free(pVVar24);
    pAig->vGateClasses = (Vec_Int_t *)0x0;
    goto LAB_0060e9b7;
  }
LAB_0060e355:
  if (local_464 != 1) {
    __assert_fail("Status == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x712,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if (pGVar19 == (Gia_Man_t *)0x0) {
    iVar13 = 1;
    if (uVar27 != 0) goto LAB_0060e3b0;
    lVar29 = *(long *)&p->nRegs + 0x80;
    *(int *)lVar29 = *(int *)lVar29 + 1;
  }
  else {
    iVar13 = *(int *)((long)&pGVar19->pName + 4) + 1;
    pGVar33 = pGVar19;
    Gia_GlaAddToCounters((Gla_Man_t *)p,(Vec_Int_t *)pGVar19);
    if (uVar27 != 0) {
LAB_0060e3b0:
      *(undefined4 *)(*(long *)&p->nRegs + 0x80) = 0;
      sat_solver2_rollback((sat_solver2 *)(p->vHash).pArray);
      Gla_ManRollBack((Gla_Man_t *)p);
      *(undefined4 *)&p->vCos = local_430;
      Gia_GlaAddToAbs((Gla_Man_t *)p,(Vec_Int_t *)pGVar19,0);
      Gia_GlaAddOneSlice((Gla_Man_t *)p,(int)local_448,(Vec_Int_t *)pGVar19);
      if ((int *)pGVar19->pSpec != (int *)0x0) {
        free(pGVar19->pSpec);
      }
      free(pGVar19);
      iVar37 = clock_gettime(3,(timespec *)&local_418);
      if (iVar37 < 0) {
        lVar29 = 1;
      }
      else {
        lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418.pSpec),8);
        lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + (long)local_418.pName * -1000000;
      }
      pGVar19 = (Gia_Man_t *)
                Gla_ManUnsatCore((Gla_Man_t *)p,(int)local_448,(sat_solver2 *)(p->vHash).pArray,
                                 pAVar30->nConfLimit,(int)pGVar36,&local_464,&local_41c);
      p_02 = (Gia_Man_t *)0x3;
      iVar37 = clock_gettime(3,(timespec *)&local_418);
      if (iVar37 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      p->pReprsOld = (int *)((long)p->pReprsOld + lVar28 + lVar29);
      if (pGVar19 != (Gia_Man_t *)0x0) {
        if ((int *)pGVar19->pSpec != (int *)0x0) {
          free(pGVar19->pSpec);
        }
        free(pGVar19);
        p_02 = pGVar19;
      }
      local_474 = (uint)local_448;
      lVar29 = local_458;
      if (local_464 == -1) goto LAB_0060e73d;
      if (local_464 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x738,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      bVar12 = 0;
      pGVar33 = pAig;
      goto LAB_0060e518;
    }
    lVar29 = *(long *)&p->nRegs + 0x80;
    *(int *)lVar29 = *(int *)lVar29 + 1;
    if ((int *)pGVar19->pSpec != (int *)0x0) {
      free(pGVar19->pSpec);
    }
    free(pGVar19);
    p_02 = pGVar19;
  }
  bVar12 = 1;
  local_474 = (uint)local_448;
LAB_0060e518:
  iVar37 = (int)pGVar33;
  if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
    iVar14 = (p->vHash).pArray[0x8c];
    iVar37 = clock_gettime(3,(timespec *)&local_418);
    p = local_428;
    if (iVar37 < 0) {
      lVar29 = -1;
    }
    else {
      lVar29 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    pGVar36 = (Gia_Man_t *)(ulong)uVar27;
    p_02 = local_428;
    iVar37 = iVar13;
    Gla_ManAbsPrintFrame
              ((Gla_Man_t *)local_428,iVar13,uVar15,iVar14 - local_42c,uVar27,lVar29 - local_458);
  }
  pAVar30 = local_450;
  if ((bool)((local_438 != 0 && 2 < local_474) & bVar12)) {
    iVar13 = Abc_FrameIsBridgeMode();
    pAVar30 = local_450;
    if (iVar13 != 0) {
      if (local_43c != 0) {
        Gia_GlaSendCancel((Gla_Man_t *)p_02,iVar37);
      }
      Gia_GlaSendAbsracted((Gla_Man_t *)p,iVar37);
      local_43c = 1;
    }
    if (*(int *)(*(long *)&p->nRegs + 0x54) != 0) {
      Abc_FrameSetStatus(-1);
      Abc_FrameSetCex((Abc_Cex_t *)0x0);
      Abc_FrameSetNFrames(uVar15);
      pcVar34 = *(char **)(*(long *)&p->nRegs + 0x68);
      if (pcVar34 == (char *)0x0) {
        pcVar34 = "glabs.aig";
      }
      pcVar34 = Extra_FileNameGenericAppend(pcVar34,".status");
      sprintf((char *)&local_418,"write_status %s",pcVar34);
      pAbc = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAbc,(char *)&local_418);
      Gia_GlaDumpAbsracted((Gla_Man_t *)p,pAVar30->fVerbose);
    }
  }
  lVar29 = local_458;
  iVar13 = Gia_GlaAbsCount((Gla_Man_t *)p,0,0);
  if (((100 - pAVar30->nRatioMin) * (p->nBufs + -1)) / 100 <= iVar13) {
    local_464 = -1;
    goto LAB_0060e73d;
  }
  pAVar18 = *(Abs_Par_t **)&p->nRegs;
  uVar35 = (ulong)uVar15;
  local_474 = uVar15;
  local_438 = uVar27;
  if (pAVar18->nFramesMax <= (int)uVar15 && pAVar18->nFramesMax != 0) goto LAB_0060e73d;
  goto LAB_0060dbda;
}

Assistant:

int Gia_ManPerformGlaOld( Gia_Man_t * pAig, Abs_Par_t * pPars, int fStartVta )
{
    extern int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars );
    extern void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN );
    Gla_Man_t * p;
    Vec_Int_t * vPPis, * vCore;//, * vCore2 = NULL;
    Abc_Cex_t * pCex = NULL;
    int f, i, iPrev, nConfls, Status, nVarsOld = 0, nCoreSize, fOneIsSent = 0, RetValue = -1;
    abctime clk2, clk = Abc_Clock();
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vGateClasses == NULL )
    {
        if ( fStartVta )
        {
            int nFramesMaxOld   = pPars->nFramesMax;
            int nFramesStartOld = pPars->nFramesStart;
            int nTimeOutOld     = pPars->nTimeOut;
            int nDumpOld        = pPars->fDumpVabs;
            pPars->nFramesMax   = pPars->nFramesStart;
            pPars->nFramesStart = Abc_MinInt( pPars->nFramesStart/2 + 1, 3 );
            pPars->nTimeOut     = 20;
            pPars->fDumpVabs    = 0;
            RetValue = Gia_VtaPerformInt( pAig, pPars );
            pPars->nFramesMax   = nFramesMaxOld;
            pPars->nFramesStart = nFramesStartOld;
            pPars->nTimeOut     = nTimeOutOld;
            pPars->fDumpVabs    = nDumpOld;
            // create gate classes
            Vec_IntFreeP( &pAig->vGateClasses );
            if ( pAig->vObjClasses )
                pAig->vGateClasses = Gia_VtaConvertToGla( pAig, pAig->vObjClasses );
            Vec_IntFreeP( &pAig->vObjClasses );
            // return if VTA solve the problem if could not start
            if ( RetValue == 0 || pAig->vGateClasses == NULL )
                return RetValue;
        }
        else
        {
            pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
            Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
            Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
        }
    }
    // start the manager
    p = Gla_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    for ( f = i = iPrev = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++, iPrev = i )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;

        // load timeframe
        Gia_GlaAddTimeFrame( p, f );

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
//            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 || (p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit) ) // resource limit is reached
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
//                if ( Gia_ManRegNum(p->pGia) > 1 ) // for comb cases, return the abstraction
//                    Vec_IntShrink( p->vAbs, p->nAbsOld );
                goto finish;
            }
            if ( Status == 1 )
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            } 
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;

            // cancel old one if it was sent
            if ( Abc_FrameIsBridgeMode() && fOneIsSent )
            {
                Gia_GlaSendCancel( p, pPars->fVerbose );
                fOneIsSent = 0;
            }

            // perform the refinement
            clk2 = Abc_Clock();
            if ( pPars->fAddLayer )
            {
                vPPis = Gla_ManCollectPPis( p, NULL );
//                Gla_ManExplorePPis( p, vPPis );
            }
            else
            {
                vPPis = Gla_ManRefinement( p );
                if ( vPPis == NULL )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    pCex = p->pGia->pCexSeq; p->pGia->pCexSeq = NULL;
                    break;
                }
            } 
            assert( pCex == NULL );

            // start proof logging
            if ( i == 0 )
            {
                // create bookmark to be used for rollback
                sat_solver2_bookmark( p->pSat );
                Vec_IntClear( p->vAddedNew );
                p->nAbsOld = Vec_IntSize( p->vAbs );
                nVarsOld = p->nSatVars;
//                p->nLrnOld = sat_solver2_nlearnts( p->pSat );
//                p->nAbsNew = 0;
//                p->nLrnNew = 0;

                // start incremental proof manager
                assert( p->pSat->pPrf2 == NULL );
                if ( p->pSat->pPrf1 == NULL )
                    p->pSat->pPrf2 = Prf_ManAlloc();
                if ( p->pSat->pPrf2 )
                {
                    p->nProofIds = 0;
                    Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                    Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                }
            }
            else
            {
                // resize the proof logger
                if ( p->pSat->pPrf2 )
                    Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
            }

            Gia_GlaAddToAbs( p, vPPis, 1 );
            Gia_GlaAddOneSlice( p, f, vPPis );
            Vec_IntFree( vPPis );

            // print the result (do not count it towards change)
            if ( p->pPars->fVerbose )
            Gla_ManAbsPrintFrame( p, -1, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );
        }
        if ( pCex != NULL )
            break;
        assert( Status == 1 );

        // valid core is obtained
        nCoreSize = 1;
        if ( vCore )
        {
            nCoreSize += Vec_IntSize( vCore );
            Gia_GlaAddToCounters( p, vCore );
        }
        if ( i == 0 )
        {
            p->pPars->nFramesNoChange++;
            Vec_IntFreeP( &vCore );
        }
        else
        {
            p->pPars->nFramesNoChange = 0;
//            p->nAbsNew = Vec_IntSize( p->vAbs ) - p->nAbsOld;
//            p->nLrnNew = Abc_AbsInt( sat_solver2_nlearnts( p->pSat ) - p->nLrnOld );
            // update the SAT solver
            sat_solver2_rollback( p->pSat );
            // update storage
            Gla_ManRollBack( p );
            p->nSatVars = nVarsOld;
            // load this timeframe
            Gia_GlaAddToAbs( p, vCore, 0 );
            Gia_GlaAddOneSlice( p, f, vCore );
            Vec_IntFree( vCore );
            // run SAT solver
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
            p->timeUnsat += Abc_Clock() - clk2;
//            assert( (vCore != NULL) == (Status == 1) );
            Vec_IntFreeP( &vCore );
            if ( Status == -1 ) // resource limit is reached
                break;
            if ( Status == 0 )
            {
                assert( 0 );
    //            Vta_ManSatVerify( p );
                // make sure, there was no initial abstraction (otherwise, it was invalid)
                assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
    //            pCex = Vga_ManDeriveCex( p );
                break;
            }
        }
        // print the result
        if ( p->pPars->fVerbose )
        Gla_ManAbsPrintFrame( p, nCoreSize, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );

        if ( f > 2 && iPrev > 0 && i == 0 ) // change has happened
        {
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_GlaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_GlaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }

            // dump the model into file
            if ( p->pPars->fDumpVabs )
            {
                char Command[1000];
                Abc_FrameSetStatus( -1 );
                Abc_FrameSetCex( NULL );
                Abc_FrameSetNFrames( f+1 );
                sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status") );
                Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                Gia_GlaDumpAbsracted( p, pPars->fVerbose );
            }
        }

        // check if the number of objects is below limit
        if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
//        if ( pAig->vGateClasses != NULL )
//            Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Gla_ManTranslate( p );
        if ( Status == -1 )
        {
            if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
            else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
            else if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
                Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
            else
                Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
        }
        else
        {
            p->pPars->iFrame++;
            Abc_Print( 1, "GLA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( pAig, pCex, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gla_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( pAig, p->pPars, p->pSat, p->pPars->iFrame, 1 );
    Gla_ManStop( p );
    fflush( stdout );
    return RetValue;
}